

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_utils.hpp
# Opt level: O2

void __thiscall
ELFIO::address_translator::set_address_translation
          (address_translator *this,
          vector<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>
          *addr_trans)

{
  std::vector<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>::operator=
            (&this->addr_translations,addr_trans);
  std::
  __sort<__gnu_cxx::__normal_iterator<ELFIO::address_translation*,std::vector<ELFIO::address_translation,std::allocator<ELFIO::address_translation>>>,__gnu_cxx::__ops::_Iter_comp_iter<ELFIO::address_translator::set_address_translation(std::vector<ELFIO::address_translation,std::allocator<ELFIO::address_translation>>&)::_lambda(ELFIO::address_translation_const&,ELFIO::address_translation_const&)_1_>>
            ((this->addr_translations).
             super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->addr_translations).
             super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void set_address_translation( std::vector<address_translation>& addr_trans )
    {
        addr_translations = addr_trans;

        std::sort( addr_translations.begin(), addr_translations.end(),
                   []( const address_translation& a,
                       const address_translation& b ) -> bool {
                       return a.start < b.start;
                   } );
    }